

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

void wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>::scan(Mapper *self,Expression **currp)

{
  char *__function;
  Expression *currp_00;
  Expression *pEVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_> *pPVar5;
  _func_void_Mapper_ptr_Expression_ptr_ptr *local_40;
  Expression *local_38;
  
  pEVar1 = *currp;
  switch(pEVar1->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
                       ,0xb0);
  case BlockId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
              super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>;
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitBlock,currp);
    if (pEVar1->_id != BlockId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Block]";
      goto LAB_006fff08;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) {
LAB_006ffb8b:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
                  (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case IfId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
              super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>;
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitIf,currp);
    if (pEVar1->_id != IfId) {
      __function = "T *wasm::Expression::cast() [T = wasm::If]";
      goto LAB_006fff08;
    }
    local_38 = pEVar1 + 2;
    local_40 = scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper,wasm::Visitor<wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper,wasm::Visitor<wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                     super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                     super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,scan,
               (Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_006ffad0;
  case LoopId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitLoop,currp);
    if (pEVar1->_id != LoopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_006fff08;
    }
    goto LAB_006ff732;
  case BreakId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitBreak,currp);
    if (pEVar1->_id != BreakId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      goto LAB_006fff08;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper,wasm::Visitor<wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper,wasm::Visitor<wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                     super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                     super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    if (*(long *)(pEVar1 + 2) == 0) {
      return;
    }
    goto LAB_006ff347;
  case SwitchId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
              super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>;
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitSwitch,currp);
    if (pEVar1->_id != SwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Switch]";
      goto LAB_006fff08;
    }
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,scan,
               (Expression **)&pEVar1[4].type);
    local_38 = pEVar1 + 4;
    lVar4 = *(long *)(pEVar1 + 4);
    goto joined_r0x006ff0d5;
  case CallId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
              super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>;
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitCall,currp);
    if (pEVar1->_id != CallId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Call]";
      goto LAB_006fff08;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_006ffb8b;
        Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
                  (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case CallIndirectId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
              super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>;
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitCallIndirect,currp);
    if (pEVar1->_id != CallIndirectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallIndirect]";
      goto LAB_006fff08;
    }
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,scan,
               (Expression **)&pEVar1[3].type);
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 2)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 2) & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(pEVar1 + 2) <= uVar3 - 2) goto LAB_006ffb8b;
        Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
                  (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,scan,
                   (Expression **)(pEVar1[1].type.id + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case LocalGetId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitLocalGet,currp);
    if (pEVar1->_id != LocalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
      goto LAB_006fff08;
    }
    break;
  case LocalSetId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitLocalSet,currp);
    if (pEVar1->_id != LocalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
      goto LAB_006fff08;
    }
    goto LAB_006ff834;
  case GlobalGetId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitGlobalGet,currp);
    if (pEVar1->_id != GlobalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalGet]";
      goto LAB_006fff08;
    }
    break;
  case GlobalSetId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitGlobalSet,currp);
    if (pEVar1->_id != GlobalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalSet]";
      goto LAB_006fff08;
    }
    goto LAB_006ff732;
  case LoadId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitLoad,currp);
    if (pEVar1->_id == LoadId) {
      pEVar1 = pEVar1 + 3;
      goto LAB_006ffad0;
    }
    __function = "T *wasm::Expression::cast() [T = wasm::Load]";
    goto LAB_006fff08;
  case StoreId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitStore,currp);
    if (pEVar1->_id != StoreId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Store]";
      goto LAB_006fff08;
    }
    goto LAB_006ff7f9;
  case ConstId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitConst,currp);
    if (pEVar1->_id != ConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Const]";
      goto LAB_006fff08;
    }
    break;
  case UnaryId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitUnary,currp);
    if (pEVar1->_id != UnaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unary]";
      goto LAB_006fff08;
    }
    goto LAB_006ff834;
  case BinaryId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitBinary,currp);
    if (pEVar1->_id != BinaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Binary]";
      goto LAB_006fff08;
    }
    goto LAB_006ffab0;
  case SelectId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitSelect,currp);
    if (pEVar1->_id != SelectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Select]";
      goto LAB_006fff08;
    }
    goto LAB_006ff426;
  case DropId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitDrop,currp);
    if (pEVar1->_id != DropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Drop]";
      goto LAB_006fff08;
    }
    goto LAB_006ffa84;
  case ReturnId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitReturn,currp);
    if (pEVar1->_id != ReturnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Return]";
      goto LAB_006fff08;
    }
    goto LAB_006ff0cc;
  case MemorySizeId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitMemorySize,currp);
    if (pEVar1->_id != MemorySizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemorySize]";
      goto LAB_006fff08;
    }
    break;
  case MemoryGrowId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitMemoryGrow,currp);
    if (pEVar1->_id != MemoryGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryGrow]";
      goto LAB_006fff08;
    }
    goto LAB_006ffa84;
  case NopId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitNop,currp);
    if (pEVar1->_id != NopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Nop]";
      goto LAB_006fff08;
    }
    break;
  case UnreachableId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitUnreachable,currp);
    if (pEVar1->_id != UnreachableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unreachable]";
      goto LAB_006fff08;
    }
    break;
  case AtomicRMWId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitAtomicRMW,currp);
    if (pEVar1->_id != AtomicRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicRMW]";
      goto LAB_006fff08;
    }
    goto LAB_006ff8df;
  case AtomicCmpxchgId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitAtomicCmpxchg,currp);
    if (pEVar1->_id != AtomicCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicCmpxchg]";
      goto LAB_006fff08;
    }
    goto LAB_006ff8c5;
  case AtomicWaitId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitAtomicWait,currp);
    if (pEVar1->_id != AtomicWaitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicWait]";
      goto LAB_006fff08;
    }
    goto LAB_006fef53;
  case AtomicNotifyId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitAtomicNotify,currp);
    if (pEVar1->_id != AtomicNotifyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicNotify]";
      goto LAB_006fff08;
    }
    goto LAB_006ffab0;
  case AtomicFenceId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitAtomicFence,currp);
    if (pEVar1->_id != AtomicFenceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicFence]";
      goto LAB_006fff08;
    }
    break;
  case SIMDExtractId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitSIMDExtract,currp);
    if (pEVar1->_id != SIMDExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDExtract]";
      goto LAB_006fff08;
    }
    goto LAB_006ff834;
  case SIMDReplaceId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitSIMDReplace,currp);
    if (pEVar1->_id != SIMDReplaceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDReplace]";
      goto LAB_006fff08;
    }
    currp_00 = (Expression *)&pEVar1[2].type;
    goto LAB_006ffabb;
  case SIMDShuffleId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitSIMDShuffle,currp);
    if (pEVar1->_id != SIMDShuffleId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShuffle]";
      goto LAB_006fff08;
    }
    goto LAB_006ffa22;
  case SIMDTernaryId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitSIMDTernary,currp);
    if (pEVar1->_id != SIMDTernaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDTernary]";
      goto LAB_006fff08;
    }
    goto LAB_006fef53;
  case SIMDShiftId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitSIMDShift,currp);
    if (pEVar1->_id != SIMDShiftId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShift]";
      goto LAB_006fff08;
    }
    goto LAB_006ffab0;
  case SIMDLoadId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitSIMDLoad,currp);
    if (pEVar1->_id != SIMDLoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoad]";
      goto LAB_006fff08;
    }
    goto LAB_006ff65b;
  case SIMDLoadStoreLaneId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitSIMDLoadStoreLane,currp);
    if (pEVar1->_id != SIMDLoadStoreLaneId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoadStoreLane]";
      goto LAB_006fff08;
    }
LAB_006ff7f9:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,scan,
               (Expression **)&pEVar1[3].type);
    pEVar1 = pEVar1 + 3;
    goto LAB_006ffad0;
  case MemoryInitId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitMemoryInit,currp);
    if (pEVar1->_id != MemoryInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryInit]";
      goto LAB_006fff08;
    }
LAB_006ff8c5:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,scan,(Expression **)(pEVar1 + 3))
    ;
    goto LAB_006ff8df;
  case DataDropId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitDataDrop,currp);
    if (pEVar1->_id != DataDropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::DataDrop]";
      goto LAB_006fff08;
    }
    break;
  case MemoryCopyId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitMemoryCopy,currp);
    if (pEVar1->_id != MemoryCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryCopy]";
      goto LAB_006fff08;
    }
    goto LAB_006ff426;
  case MemoryFillId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitMemoryFill,currp);
    if (pEVar1->_id != MemoryFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryFill]";
      goto LAB_006fff08;
    }
    goto LAB_006ff426;
  case PopId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitPop,currp);
    if (pEVar1->_id != PopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Pop]";
      goto LAB_006fff08;
    }
    break;
  case RefNullId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitRefNull,currp);
    if (pEVar1->_id != RefNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefNull]";
      goto LAB_006fff08;
    }
    break;
  case RefIsNullId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitRefIsNull,currp);
    if (pEVar1->_id != RefIsNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefIsNull]";
      goto LAB_006fff08;
    }
    goto LAB_006ffa84;
  case RefFuncId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitRefFunc,currp);
    if (pEVar1->_id != RefFuncId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefFunc]";
      goto LAB_006fff08;
    }
    break;
  case RefEqId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitRefEq,currp);
    if (pEVar1->_id != RefEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefEq]";
      goto LAB_006fff08;
    }
    goto LAB_006ffa22;
  case TableGetId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitTableGet,currp);
    if (pEVar1->_id != TableGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGet]";
      goto LAB_006fff08;
    }
    goto LAB_006ff732;
  case TableSetId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitTableSet,currp);
    if (pEVar1->_id != TableSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSet]";
      goto LAB_006fff08;
    }
    goto LAB_006ff8df;
  case TableSizeId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitTableSize,currp);
    if (pEVar1->_id != TableSizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSize]";
      goto LAB_006fff08;
    }
    break;
  case TableGrowId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitTableGrow,currp);
    if (pEVar1->_id != TableGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGrow]";
      goto LAB_006fff08;
    }
LAB_006ff8df:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,scan,
               (Expression **)&pEVar1[2].type);
    pEVar1 = pEVar1 + 2;
    goto LAB_006ffad0;
  case TryId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
              super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>;
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitTry,currp);
    if (pEVar1->_id != TryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
      goto LAB_006fff08;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 5)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 5) & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(pEVar1 + 5) <= uVar3 - 2) goto LAB_006ffb8b;
        Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
                  (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,scan,
                   (Expression **)(pEVar1[4].type.id + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
LAB_006ff732:
    pEVar1 = pEVar1 + 2;
    goto LAB_006ffad0;
  case ThrowId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
              super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>;
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitThrow,currp);
    if (pEVar1->_id != ThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Throw]";
      goto LAB_006fff08;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) goto LAB_006ffb8b;
        Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
                  (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case RethrowId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitRethrow,currp);
    if (pEVar1->_id != RethrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Rethrow]";
      goto LAB_006fff08;
    }
    break;
  case TupleMakeId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
              super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>;
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitTupleMake,currp);
    if (pEVar1->_id != TupleMakeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleMake]";
      goto LAB_006fff08;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_006ffb8b;
        Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
                  (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case TupleExtractId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitTupleExtract,currp);
    if (pEVar1->_id != TupleExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleExtract]";
      goto LAB_006fff08;
    }
    goto LAB_006ffa84;
  case I31NewId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitI31New,currp);
    if (pEVar1->_id != I31NewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31New]";
      goto LAB_006fff08;
    }
    goto LAB_006ffa84;
  case I31GetId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitI31Get,currp);
    if (pEVar1->_id != I31GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31Get]";
      goto LAB_006fff08;
    }
    goto LAB_006ffa84;
  case CallRefId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
              super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>;
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitCallRef,currp);
    if (pEVar1->_id != CallRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallRef]";
      goto LAB_006fff08;
    }
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,scan,
               (Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_006ffb8b;
        Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
                  (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case RefTestId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitRefTest,currp);
    if (pEVar1->_id != RefTestId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefTest]";
      goto LAB_006fff08;
    }
    goto LAB_006ffa84;
  case RefCastId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitRefCast,currp);
    if (pEVar1->_id != RefCastId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefCast]";
      goto LAB_006fff08;
    }
    goto LAB_006ffa84;
  case BrOnId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitBrOn,currp);
    if (pEVar1->_id != BrOnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::BrOn]";
      goto LAB_006fff08;
    }
LAB_006ff65b:
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_006ffad0;
  case StructNewId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
              super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>;
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitStructNew,currp);
    if (pEVar1->_id != StructNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructNew]";
      goto LAB_006fff08;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_006ffb8b;
        Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
                  (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case StructGetId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitStructGet,currp);
    if (pEVar1->_id != StructGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructGet]";
      goto LAB_006fff08;
    }
    goto LAB_006ff834;
  case StructSetId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitStructSet,currp);
    if (pEVar1->_id != StructSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructSet]";
      goto LAB_006fff08;
    }
    goto LAB_006ffab0;
  case ArrayNewId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
              super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>;
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitArrayNew,currp);
    if (pEVar1->_id != ArrayNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNew]";
      goto LAB_006fff08;
    }
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,scan,
               (Expression **)&pEVar1[1].type);
LAB_006ff0cc:
    local_38 = pEVar1 + 1;
    lVar4 = *(long *)(pEVar1 + 1);
joined_r0x006ff0d5:
    if (lVar4 != 0) {
LAB_006ff347:
      local_40 = scan;
      SmallVector<wasm::Walker<wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper,wasm::Visitor<wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper,wasm::Visitor<wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                     super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                     super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    break;
  case ArrayNewSegId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitArrayNewSeg,currp);
    if (pEVar1->_id != ArrayNewSegId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewSeg]";
      goto LAB_006fff08;
    }
    goto LAB_006ff17c;
  case ArrayNewFixedId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
              super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>;
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitArrayNewFixed,currp);
    if (pEVar1->_id != ArrayNewFixedId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewFixed]";
      goto LAB_006fff08;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_006ffb8b;
        Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
                  (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case ArrayGetId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitArrayGet,currp);
    if (pEVar1->_id != ArrayGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayGet]";
      goto LAB_006fff08;
    }
    goto LAB_006ffa22;
  case ArraySetId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitArraySet,currp);
    if (pEVar1->_id != ArraySetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArraySet]";
      goto LAB_006fff08;
    }
    goto LAB_006ff426;
  case ArrayLenId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitArrayLen,currp);
    if (pEVar1->_id != ArrayLenId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayLen]";
      goto LAB_006fff08;
    }
    goto LAB_006ffa84;
  case ArrayCopyId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
              super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>;
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitArrayCopy,currp);
    if (pEVar1->_id != ArrayCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayCopy]";
      goto LAB_006fff08;
    }
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,scan,
               (Expression **)(pEVar1 + 3));
    goto LAB_006feeed;
  case ArrayFillId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitArrayFill,currp);
    if (pEVar1->_id != ArrayFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayFill]";
      goto LAB_006fff08;
    }
LAB_006feeed:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,scan,
               (Expression **)&pEVar1[2].type);
    goto LAB_006ff426;
  case ArrayInitId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
              super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>;
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitArrayInit,currp);
    if (pEVar1->_id != ArrayInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInit]";
      goto LAB_006fff08;
    }
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,scan,
               (Expression **)(pEVar1 + 4));
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,scan,
               (Expression **)&pEVar1[3].type);
LAB_006ff17c:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,scan,(Expression **)(pEVar1 + 3))
    ;
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_006ffad0;
  case RefAsId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitRefAs,currp);
    if (pEVar1->_id != RefAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefAs]";
      goto LAB_006fff08;
    }
    goto LAB_006ff834;
  case StringNewId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitStringNew,currp);
    if (pEVar1->_id == StringNewId) {
      local_38 = pEVar1 + 3;
      local_40 = scan;
      if (*(long *)(pEVar1 + 3) != 0) {
        SmallVector<wasm::Walker<wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper,wasm::Visitor<wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper,void>>::Task,10ul>
        ::
        emplace_back<void(*&)(wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper*,wasm::Expression**),wasm::Expression**&>
                  ((SmallVector<wasm::Walker<wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper,wasm::Visitor<wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper,void>>::Task,10ul>
                    *)&(self->
                       super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                       super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                       super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.stack,&local_40,
                   (Expression ***)&local_38);
      }
      local_38 = (Expression *)&pEVar1[2].type;
      local_40 = scan;
      if (pEVar1[2].type.id != 0) {
        SmallVector<wasm::Walker<wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper,wasm::Visitor<wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper,void>>::Task,10ul>
        ::
        emplace_back<void(*&)(wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper*,wasm::Expression**),wasm::Expression**&>
                  ((SmallVector<wasm::Walker<wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper,wasm::Visitor<wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper,void>>::Task,10ul>
                    *)&(self->
                       super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                       super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                       super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.stack,&local_40,
                   (Expression ***)&local_38);
      }
      local_38 = pEVar1 + 2;
      local_40 = scan;
      if (*(long *)(pEVar1 + 2) != 0) {
        SmallVector<wasm::Walker<wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper,wasm::Visitor<wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper,void>>::Task,10ul>
        ::
        emplace_back<void(*&)(wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper*,wasm::Expression**),wasm::Expression**&>
                  ((SmallVector<wasm::Walker<wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper,wasm::Visitor<wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper,void>>::Task,10ul>
                    *)&(self->
                       super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                       super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                       super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.stack,&local_40,
                   (Expression ***)&local_38);
      }
      pEVar1 = (Expression *)&pEVar1[1].type;
      goto LAB_006ffad0;
    }
    __function = "T *wasm::Expression::cast() [T = wasm::StringNew]";
    goto LAB_006fff08;
  case StringConstId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitStringConst,currp);
    if (pEVar1->_id != StringConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConst]";
      goto LAB_006fff08;
    }
    break;
  case StringMeasureId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitStringMeasure,currp);
    if (pEVar1->_id != StringMeasureId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringMeasure]";
      goto LAB_006fff08;
    }
    goto LAB_006ff834;
  case StringEncodeId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
              super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>;
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitStringEncode,currp);
    if (pEVar1->_id == StringEncodeId) {
      local_38 = (Expression *)&pEVar1[2].type;
      local_40 = scan;
      if (pEVar1[2].type.id != 0) {
        SmallVector<wasm::Walker<wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper,wasm::Visitor<wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper,void>>::Task,10ul>
        ::
        emplace_back<void(*&)(wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper*,wasm::Expression**),wasm::Expression**&>
                  ((SmallVector<wasm::Walker<wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper,wasm::Visitor<wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>)::Mapper,void>>::Task,10ul>
                    *)&(self->
                       super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                       super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                       super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.stack,&local_40,
                   (Expression ***)&local_38);
      }
      Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
                (&pPVar5->super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,scan,
                 (Expression **)(pEVar1 + 2));
      pEVar1 = (Expression *)&pEVar1[1].type;
      goto LAB_006ffad0;
    }
    __function = "T *wasm::Expression::cast() [T = wasm::StringEncode]";
LAB_006fff08:
    __assert_fail("int(_id) == int(T::SpecificId)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                  ,0x314,__function);
  case StringConcatId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitStringConcat,currp);
    if (pEVar1->_id != StringConcatId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConcat]";
      goto LAB_006fff08;
    }
    goto LAB_006ffa22;
  case StringEqId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitStringEq,currp);
    if (pEVar1->_id != StringEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEq]";
      goto LAB_006fff08;
    }
    goto LAB_006ffab0;
  case StringAsId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitStringAs,currp);
    if (pEVar1->_id != StringAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringAs]";
      goto LAB_006fff08;
    }
LAB_006ff834:
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_006ffad0;
  case StringWTF8AdvanceId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitStringWTF8Advance,currp);
    if (pEVar1->_id != StringWTF8AdvanceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF8Advance]";
      goto LAB_006fff08;
    }
LAB_006ff426:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,scan,(Expression **)(pEVar1 + 2))
    ;
    goto LAB_006ffa22;
  case StringWTF16GetId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitStringWTF16Get,currp);
    if (pEVar1->_id != StringWTF16GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF16Get]";
      goto LAB_006fff08;
    }
    goto LAB_006ffa22;
  case StringIterNextId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitStringIterNext,currp);
    if (pEVar1->_id != StringIterNextId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterNext]";
      goto LAB_006fff08;
    }
LAB_006ffa84:
    pEVar1 = pEVar1 + 1;
LAB_006ffad0:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,scan,(Expression **)pEVar1);
    return;
  case StringIterMoveId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitStringIterMove,currp);
    if (pEVar1->_id != StringIterMoveId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterMove]";
      goto LAB_006fff08;
    }
LAB_006ffab0:
    currp_00 = pEVar1 + 2;
LAB_006ffabb:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,scan,(Expression **)currp_00);
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_006ffad0;
  case StringSliceWTFId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitStringSliceWTF,currp);
    if (pEVar1->_id != StringSliceWTFId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceWTF]";
      goto LAB_006fff08;
    }
LAB_006fef53:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,scan,
               (Expression **)&pEVar1[2].type);
    currp_00 = pEVar1 + 2;
    goto LAB_006ffabb;
  case StringSliceIterId:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,
               Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::doVisitStringSliceIter,currp);
    if (pEVar1->_id != StringSliceIterId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceIter]";
      goto LAB_006fff08;
    }
LAB_006ffa22:
    Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
                super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>,scan,
               (Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_006ffad0;
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }